

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateFtest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  uint *puVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  pointer pnVar8;
  pointer pnVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  long lVar11;
  ulong uVar12;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  theeps;
  cpp_dec_float<50U,_int,_void> local_f8;
  cpp_dec_float<50U,_int,_void> local_b8;
  cpp_dec_float<50U,_int,_void> *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_78;
  DIdxSet *local_40;
  DIdxSet *local_38;
  
  pUVar2 = this->theFvec;
  (this->updateViols).super_IdxSet.num = 0;
  entertol(&local_78,this);
  lVar11 = (long)(pUVar2->thedelta).super_IdxSet.num;
  if (0 < lVar11) {
    local_38 = &this->updateViols;
    local_80 = &(this->m_pricingViol).m_backend;
    local_40 = &this->infeasibilities;
    uVar12 = lVar11 + 1;
    do {
      iVar6 = (pUVar2->thedelta).super_IdxSet.idx[uVar12 - 2];
      if (this->m_pricingViolUpToDate == true) {
        pcVar10 = &(this->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend;
        local_b8.data._M_elems[0] = local_78.m_backend.data._M_elems[0];
        local_b8.data._M_elems[1] = local_78.m_backend.data._M_elems[1];
        uVar3 = local_b8.data._M_elems._0_8_;
        local_b8.data._M_elems[2] = local_78.m_backend.data._M_elems[2];
        local_b8.data._M_elems[3] = local_78.m_backend.data._M_elems[3];
        local_b8.data._M_elems._32_5_ = local_78.m_backend.data._M_elems._32_5_;
        local_b8.data._M_elems[9]._1_3_ = local_78.m_backend.data._M_elems[9]._1_3_;
        local_b8.data._M_elems[4] = local_78.m_backend.data._M_elems[4];
        local_b8.data._M_elems[5] = local_78.m_backend.data._M_elems[5];
        local_b8.data._M_elems._24_5_ = local_78.m_backend.data._M_elems._24_5_;
        local_b8.data._M_elems[7]._1_3_ = local_78.m_backend.data._M_elems[7]._1_3_;
        local_b8.exp = local_78.m_backend.exp;
        local_b8.neg = local_78.m_backend.neg;
        local_b8.fpclass = local_78.m_backend.fpclass;
        local_b8.prec_elem = local_78.m_backend.prec_elem;
        local_b8.data._M_elems[0] = local_78.m_backend.data._M_elems[0];
        if (local_b8.data._M_elems[0] != 0 || local_78.m_backend.fpclass != cpp_dec_float_finite) {
          local_b8.neg = (bool)(local_78.m_backend.neg ^ 1);
        }
        local_b8.data._M_elems._0_8_ = uVar3;
        if ((local_78.m_backend.fpclass != cpp_dec_float_NaN) &&
           (pcVar10->fpclass != cpp_dec_float_NaN)) {
          iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar10,&local_b8);
          if (iVar5 < 0) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_80,&(this->theCoTest).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend);
          }
        }
      }
      pnVar8 = (this->theFvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pnVar8[iVar6].m_backend.fpclass == cpp_dec_float_NaN) ||
         (pnVar9 = (this->theUBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         pnVar9[iVar6].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_00267618:
        pnVar9 = (this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&pnVar8[iVar6].m_backend,&pnVar9[iVar6].m_backend);
        if (iVar5 < 1) {
          pnVar8 = (this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00267618;
        }
        pnVar8 = (this->theUBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar9 = (this->theFvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      pcVar10 = &pnVar8[iVar6].m_backend;
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 10;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems._24_5_ = 0;
      local_b8.data._M_elems[7]._1_3_ = 0;
      local_b8.data._M_elems._32_5_ = 0;
      local_b8.data._M_elems[9]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      if (&local_b8 == &pnVar9[iVar6].m_backend) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_b8,pcVar10);
        if (local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite) {
          local_b8.neg = (bool)(local_b8.neg ^ 1);
        }
      }
      else {
        if (&local_b8 != pcVar10) {
          uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 8);
          local_b8.data._M_elems._32_5_ = SUB85(uVar3,0);
          local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_b8.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
          local_b8.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
          local_b8.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
          uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
          local_b8.data._M_elems._24_5_ = SUB85(uVar3,0);
          local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_b8.exp = pcVar10->exp;
          local_b8.neg = pcVar10->neg;
          local_b8.fpclass = pcVar10->fpclass;
          local_b8.prec_elem = pcVar10->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_b8,&pnVar9[iVar6].m_backend);
      }
      pnVar8 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar8[iVar6].m_backend.data + 0x20) =
           CONCAT35(local_b8.data._M_elems[9]._1_3_,local_b8.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar8[iVar6].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_b8.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_b8.data._M_elems[7]._1_3_,local_b8.data._M_elems._24_5_);
      *(undefined8 *)&pnVar8[iVar6].m_backend.data = local_b8.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar8[iVar6].m_backend.data + 8) = local_b8.data._M_elems._8_8_;
      pnVar8[iVar6].m_backend.exp = local_b8.exp;
      pnVar8[iVar6].m_backend.neg = local_b8.neg;
      pnVar8[iVar6].m_backend.fpclass = local_b8.fpclass;
      pnVar8[iVar6].m_backend.prec_elem = local_b8.prec_elem;
      if (this->sparsePricingLeave == true) {
        pcVar10 = &(this->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend;
        local_b8.data._M_elems[0] = local_78.m_backend.data._M_elems[0];
        local_b8.data._M_elems[1] = local_78.m_backend.data._M_elems[1];
        uVar3 = local_b8.data._M_elems._0_8_;
        local_b8.data._M_elems[2] = local_78.m_backend.data._M_elems[2];
        local_b8.data._M_elems[3] = local_78.m_backend.data._M_elems[3];
        local_b8.data._M_elems._32_5_ = local_78.m_backend.data._M_elems._32_5_;
        local_b8.data._M_elems[9]._1_3_ = local_78.m_backend.data._M_elems[9]._1_3_;
        local_b8.data._M_elems[4] = local_78.m_backend.data._M_elems[4];
        local_b8.data._M_elems[5] = local_78.m_backend.data._M_elems[5];
        local_b8.data._M_elems._24_5_ = local_78.m_backend.data._M_elems._24_5_;
        local_b8.data._M_elems[7]._1_3_ = local_78.m_backend.data._M_elems[7]._1_3_;
        local_b8.exp = local_78.m_backend.exp;
        local_b8.neg = local_78.m_backend.neg;
        local_b8.fpclass = local_78.m_backend.fpclass;
        local_b8.prec_elem = local_78.m_backend.prec_elem;
        local_b8.data._M_elems[0] = local_78.m_backend.data._M_elems[0];
        if (local_b8.data._M_elems[0] != 0 || local_78.m_backend.fpclass != cpp_dec_float_finite) {
          local_b8.neg = (bool)(local_78.m_backend.neg ^ 1);
        }
        local_b8.data._M_elems._0_8_ = uVar3;
        if ((local_78.m_backend.fpclass == cpp_dec_float_NaN) ||
           (pcVar10->fpclass == cpp_dec_float_NaN)) goto LAB_00267776;
        iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar10,&local_b8);
        if (-1 < iVar5) goto LAB_00267776;
        if (this->m_pricingViolUpToDate == true) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (local_80,&(this->theCoTest).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend);
        }
        if ((this->isInfeasible).data[iVar6] == 0) {
          DIdxSet::addIdx(local_40,iVar6);
          (this->isInfeasible).data[iVar6] = 1;
        }
        if (this->hyperPricingLeave == true) {
          DIdxSet::addIdx(local_38,iVar6);
        }
      }
      else {
LAB_00267776:
        if (this->m_pricingViolUpToDate == true) {
          pcVar10 = &(this->theCoTest).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend;
          local_b8.data._M_elems[0] = local_78.m_backend.data._M_elems[0];
          local_b8.data._M_elems[1] = local_78.m_backend.data._M_elems[1];
          uVar3 = local_b8.data._M_elems._0_8_;
          local_b8.data._M_elems[2] = local_78.m_backend.data._M_elems[2];
          local_b8.data._M_elems[3] = local_78.m_backend.data._M_elems[3];
          local_b8.data._M_elems._32_5_ = local_78.m_backend.data._M_elems._32_5_;
          local_b8.data._M_elems[9]._1_3_ = local_78.m_backend.data._M_elems[9]._1_3_;
          local_b8.data._M_elems[4] = local_78.m_backend.data._M_elems[4];
          local_b8.data._M_elems[5] = local_78.m_backend.data._M_elems[5];
          local_b8.data._M_elems._24_5_ = local_78.m_backend.data._M_elems._24_5_;
          local_b8.data._M_elems[7]._1_3_ = local_78.m_backend.data._M_elems[7]._1_3_;
          local_b8.exp = local_78.m_backend.exp;
          local_b8.neg = local_78.m_backend.neg;
          local_b8.fpclass = local_78.m_backend.fpclass;
          local_b8.prec_elem = local_78.m_backend.prec_elem;
          local_b8.data._M_elems[0] = local_78.m_backend.data._M_elems[0];
          if (local_b8.data._M_elems[0] != 0 || local_78.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_b8.neg = (bool)(local_78.m_backend.neg ^ 1);
          }
          local_b8.data._M_elems._0_8_ = uVar3;
          if ((local_78.m_backend.fpclass != cpp_dec_float_NaN) &&
             (pcVar10->fpclass != cpp_dec_float_NaN)) {
            iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar10,&local_b8);
            if (iVar5 < 0) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (local_80,&(this->theCoTest).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend);
            }
          }
        }
      }
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
  }
  if (0 < this->boundflips) {
    a = Tolerances::epsilon((this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 10;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems._24_5_ = 0;
    local_b8.data._M_elems[7]._1_3_ = 0;
    local_b8.data._M_elems._32_5_ = 0;
    local_b8.data._M_elems[9]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_b8,a);
    pSVar7 = this->solveVector3;
    if (0 < (pSVar7->super_IdxSet).num) {
      this_00 = &this->m_pricingViol;
      local_80 = (cpp_dec_float<50U,_int,_void> *)&this->infeasibilities;
      lVar11 = 0;
      do {
        pnVar8 = (pSVar7->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar6 = (pSVar7->super_IdxSet).idx[lVar11];
        local_f8.exp = pnVar8[iVar6].m_backend.exp;
        local_f8.neg = pnVar8[iVar6].m_backend.neg;
        local_f8.fpclass = pnVar8[iVar6].m_backend.fpclass;
        local_f8.prec_elem = pnVar8[iVar6].m_backend.prec_elem;
        puVar1 = (uint *)((long)&pnVar8[iVar6].m_backend.data + 0x10);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_f8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar8[iVar6].m_backend.data + 0x20);
        local_f8.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        if ((local_f8.neg == true) &&
           (local_f8.data._M_elems[0] = (uint)*(undefined8 *)pnVar8[iVar6].m_backend.data._M_elems,
           local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite)) {
          local_f8.neg = false;
        }
        if ((local_f8.fpclass != cpp_dec_float_NaN) && (local_b8.fpclass != cpp_dec_float_NaN)) {
          local_f8.data._M_elems._0_16_ = *(undefined1 (*) [16])&pnVar8[iVar6].m_backend.data;
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_f8,&local_b8);
          if (0 < iVar6) {
            iVar6 = (this->solveVector3->super_IdxSet).idx[lVar11];
            if (this->m_pricingViolUpToDate == true) {
              pcVar10 = &(this->theCoTest).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend;
              local_f8.data._M_elems[2] = local_78.m_backend.data._M_elems[2];
              local_f8.data._M_elems[3] = local_78.m_backend.data._M_elems[3];
              local_f8.data._M_elems[0] = local_78.m_backend.data._M_elems[0];
              local_f8.data._M_elems[1] = local_78.m_backend.data._M_elems[1];
              auVar4 = (undefined1  [16])local_f8.data._M_elems._0_16_;
              local_f8.data._M_elems[8] = local_78.m_backend.data._M_elems[8];
              local_f8.data._M_elems[9] = local_78.m_backend.data._M_elems[9];
              local_f8.data._M_elems[4] = local_78.m_backend.data._M_elems[4];
              local_f8.data._M_elems[5] = local_78.m_backend.data._M_elems[5];
              local_f8.data._M_elems._24_5_ = local_78.m_backend.data._M_elems._24_5_;
              local_f8.data._M_elems[7]._1_3_ = local_78.m_backend.data._M_elems[7]._1_3_;
              local_f8.exp = local_78.m_backend.exp;
              local_f8.neg = local_78.m_backend.neg;
              local_f8.fpclass = local_78.m_backend.fpclass;
              local_f8.prec_elem = local_78.m_backend.prec_elem;
              local_f8.data._M_elems[0] = local_78.m_backend.data._M_elems[0];
              if (local_f8.data._M_elems[0] != 0 ||
                  local_78.m_backend.fpclass != cpp_dec_float_finite) {
                local_f8.neg = (bool)(local_78.m_backend.neg ^ 1);
              }
              local_f8.data._M_elems._0_16_ = auVar4;
              if ((local_78.m_backend.fpclass != cpp_dec_float_NaN) &&
                 (pcVar10->fpclass != cpp_dec_float_NaN)) {
                iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (pcVar10,&local_f8);
                if (iVar5 < 0) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&this_00->m_backend,
                             &(this->theCoTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend);
                }
              }
            }
            pnVar8 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((pnVar8[iVar6].m_backend.fpclass == cpp_dec_float_NaN) ||
               (pnVar9 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               pnVar9[iVar6].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_00267a77:
              pnVar9 = (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&pnVar8[iVar6].m_backend,&pnVar9[iVar6].m_backend);
              if (iVar5 < 1) {
                pnVar8 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_00267a77;
              }
              pnVar8 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar9 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            pcVar10 = &pnVar8[iVar6].m_backend;
            local_f8.fpclass = cpp_dec_float_finite;
            local_f8.prec_elem = 10;
            local_f8.data._M_elems[0] = 0;
            local_f8.data._M_elems[1] = 0;
            local_f8.data._M_elems[2] = 0;
            local_f8.data._M_elems[3] = 0;
            local_f8.data._M_elems[4] = 0;
            local_f8.data._M_elems[5] = 0;
            local_f8.data._M_elems._24_5_ = 0;
            local_f8.data._M_elems[7]._1_3_ = 0;
            local_f8.data._M_elems[8] = 0;
            local_f8.data._M_elems[9] = 0;
            local_f8.exp = 0;
            local_f8.neg = false;
            if (&local_f8 == &pnVar9[iVar6].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_f8,pcVar10);
              if (local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) {
                local_f8.neg = (bool)(local_f8.neg ^ 1);
              }
            }
            else {
              if (&local_f8 != pcVar10) {
                local_f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 8);
                local_f8.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar10->data)._M_elems;
                local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
                local_f8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_f8.exp = pcVar10->exp;
                local_f8.neg = pcVar10->neg;
                local_f8.fpclass = pcVar10->fpclass;
                local_f8.prec_elem = pcVar10->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_f8,&pnVar9[iVar6].m_backend);
            }
            pnVar8 = (this->theCoTest).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)((long)&pnVar8[iVar6].m_backend.data + 0x20) =
                 local_f8.data._M_elems._32_8_;
            puVar1 = (uint *)((long)&pnVar8[iVar6].m_backend.data + 0x10);
            *(undefined8 *)puVar1 = local_f8.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT35(local_f8.data._M_elems[7]._1_3_,local_f8.data._M_elems._24_5_);
            *(undefined8 *)&pnVar8[iVar6].m_backend.data = local_f8.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar8[iVar6].m_backend.data + 8) = local_f8.data._M_elems._8_8_;
            pnVar8[iVar6].m_backend.exp = local_f8.exp;
            pnVar8[iVar6].m_backend.neg = local_f8.neg;
            pnVar8[iVar6].m_backend.fpclass = local_f8.fpclass;
            pnVar8[iVar6].m_backend.prec_elem = local_f8.prec_elem;
            if (this->sparsePricingLeave == true) {
              pcVar10 = &(this->theCoTest).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend;
              local_f8.data._M_elems[8] = local_78.m_backend.data._M_elems[8];
              local_f8.data._M_elems[9] = local_78.m_backend.data._M_elems[9];
              local_f8.data._M_elems[4] = local_78.m_backend.data._M_elems[4];
              local_f8.data._M_elems[5] = local_78.m_backend.data._M_elems[5];
              local_f8.data._M_elems._24_5_ = local_78.m_backend.data._M_elems._24_5_;
              local_f8.data._M_elems[7]._1_3_ = local_78.m_backend.data._M_elems[7]._1_3_;
              local_f8.exp = local_78.m_backend.exp;
              local_f8.neg = local_78.m_backend.neg;
              local_f8.fpclass = local_78.m_backend.fpclass;
              local_f8.prec_elem = local_78.m_backend.prec_elem;
              local_f8.data._M_elems[0] = local_78.m_backend.data._M_elems[0];
              if (local_f8.data._M_elems[0] != 0 ||
                  local_78.m_backend.fpclass != cpp_dec_float_finite) {
                local_f8.neg = (bool)(local_78.m_backend.neg ^ 1);
              }
              if ((local_78.m_backend.fpclass != cpp_dec_float_NaN) &&
                 (pcVar10->fpclass != cpp_dec_float_NaN)) {
                iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (pcVar10,&local_f8);
                if (iVar5 < 0) {
                  if (this->m_pricingViolUpToDate == true) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&this_00->m_backend,
                               &(this->theCoTest).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend);
                  }
                  if ((this->isInfeasible).data[iVar6] == 0) {
                    DIdxSet::addIdx((DIdxSet *)local_80,iVar6);
                    (this->isInfeasible).data[iVar6] = 1;
                  }
                  goto LAB_00267cae;
                }
              }
            }
            if (this->m_pricingViolUpToDate == true) {
              pcVar10 = &(this->theCoTest).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend;
              local_f8.data._M_elems[8] = local_78.m_backend.data._M_elems[8];
              local_f8.data._M_elems[9] = local_78.m_backend.data._M_elems[9];
              local_f8.data._M_elems[4] = local_78.m_backend.data._M_elems[4];
              local_f8.data._M_elems[5] = local_78.m_backend.data._M_elems[5];
              local_f8.data._M_elems._24_5_ = local_78.m_backend.data._M_elems._24_5_;
              local_f8.data._M_elems[7]._1_3_ = local_78.m_backend.data._M_elems[7]._1_3_;
              local_f8.exp = local_78.m_backend.exp;
              local_f8.neg = local_78.m_backend.neg;
              local_f8.fpclass = local_78.m_backend.fpclass;
              local_f8.prec_elem = local_78.m_backend.prec_elem;
              local_f8.data._M_elems[0] = local_78.m_backend.data._M_elems[0];
              if (local_f8.data._M_elems[0] != 0 ||
                  local_78.m_backend.fpclass != cpp_dec_float_finite) {
                local_f8.neg = (bool)(local_78.m_backend.neg ^ 1);
              }
              if ((local_78.m_backend.fpclass != cpp_dec_float_NaN) &&
                 (pcVar10->fpclass != cpp_dec_float_NaN)) {
                iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (pcVar10,&local_f8);
                if (iVar5 < 0) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&this_00->m_backend,
                             &(this->theCoTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend);
                }
              }
            }
          }
        }
LAB_00267cae:
        lVar11 = lVar11 + 1;
        pSVar7 = this->solveVector3;
      } while (lVar11 < (pSVar7->super_IdxSet).num);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateFtest()
{
   const IdxSet& idx = theFvec->idx();
   VectorBase<R>& ftest = theCoTest;      // |== fTest()|
   assert(&ftest == &fTest());

   assert(type() == LEAVE);

   updateViols.clear();
   R theeps = entertol();

   for(int j = idx.size() - 1; j >= 0; --j)
   {
      int i = idx.index(j);

      if(m_pricingViolUpToDate && ftest[i] < -theeps)
         // violation was present before this iteration
         m_pricingViol += ftest[i];

      ftest[i] = ((*theFvec)[i] > theUBbound[i])
                 ? theUBbound[i] - (*theFvec)[i]
                 : (*theFvec)[i] - theLBbound[i];

      if(sparsePricingLeave && ftest[i] < -theeps)
      {
         assert(remainingRoundsLeave == 0);

         if(m_pricingViolUpToDate)
            m_pricingViol -= ftest[i];

         if(isInfeasible[i] == SPxPricer<R>::NOT_VIOLATED)
         {
            // this can cause problems - we cannot keep on adding indeces to infeasibilities,
            // because they are not deleted in hyper mode...
            //             if( !hyperPricingLeave )
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
         }

         if(hyperPricingLeave)
            updateViols.addIdx(i);
      }
      else if(m_pricingViolUpToDate && ftest[i] < -theeps)
         m_pricingViol -= ftest[i];
   }

   // if boundflips were performed, we need to update these indices as well
   if(boundflips > 0)
   {
      R eps = epsilon();

      for(int j = 0; j < solveVector3->size(); ++j)
      {
         if(spxAbs(solveVector3->value(j)) > eps)
         {
            int i = solveVector3->index(j);

            if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol += ftest[i];

            ftest[i] = ((*theFvec)[i] > theUBbound[i]) ? theUBbound[i] - (*theFvec)[i] :
                       (*theFvec)[i] - theLBbound[i];

            if(sparsePricingLeave && ftest[i] < -theeps)
            {
               assert(remainingRoundsLeave == 0);

               if(m_pricingViolUpToDate)
                  m_pricingViol -= ftest[i];

               if(!isInfeasible[i])
               {
                  infeasibilities.addIdx(i);
                  isInfeasible[i] = true;
               }
            }
            else if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol -= ftest[i];
         }
      }
   }
}